

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_objref.cpp
# Opt level: O2

bool __thiscall
ON_ObjRef::SetParentIRef
          (ON_ObjRef *this,ON_InstanceRef *iref,ON_UUID iref_id,int idef_geometry_index)

{
  int *piVar1;
  unsigned_short uVar2;
  unsigned_short uVar3;
  bool bVar4;
  int iVar5;
  TYPE TVar6;
  ON_Geometry *pOVar7;
  ON_ObjRef_IRefID *pOVar8;
  ON_Brep *pOVar9;
  int extraout_var;
  ON_Object *pOVar10;
  ON_Geometry *pOVar11;
  ON_Mesh *pOVar12;
  int extraout_var_00;
  ON_MeshComponentRef *proxy1;
  ON_Mesh *this_00;
  ON_SubD *this_01;
  long lVar13;
  long lVar14;
  undefined8 uVar15;
  ON_Xform *pOVar16;
  ON_Xform *pOVar17;
  byte bVar18;
  ON_Xform geometry_xform;
  ON_Xform local_b0;
  
  uVar15 = iref_id._0_8_;
  bVar18 = 0;
  if ((this->m__iref).m_count < 1) {
    if ((this->m_component_index).m_type == invalid_type) {
      pOVar10 = this->m__proxy1;
      piVar1 = this->m__proxy_ref_count;
      if ((((pOVar10 != (ON_Object *)0x0 || this->m__proxy2 != (ON_Object *)0x0) ||
            piVar1 != (int *)0x0) &&
          (((((pOVar10 == (ON_Object *)0x0 || piVar1 == (int *)0x0) ||
              this->m__proxy2 != (ON_Object *)0x0 || (*piVar1 != 1)) ||
            (pOVar10 == &this->m_geometry->super_ON_Object)) ||
           (pOVar9 = ON_Brep::Cast(&this->m_geometry->super_ON_Object), pOVar9 == (ON_Brep *)0x0))))
         || (((this->m_geometry == (ON_Geometry *)0x0 ||
              (iVar5 = (*(this->m_geometry->super_ON_Object)._vptr_ON_Object[0x22])(), iVar5 != 0))
             || (this->m_geometry != this->m_parent_geometry &&
                 this->m_parent_geometry != (ON_Geometry *)0x0)))) goto LAB_0056cc14;
      pOVar12 = (ON_Mesh *)ON_Geometry::Duplicate(this->m_geometry);
      iVar5 = (*(pOVar12->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x1c])(pOVar12);
      if ((char)iVar5 != '\0') {
        iVar5 = ON_Xform::IsSimilarity(&iref->m_xform);
        if (iVar5 == -1) {
          iVar5 = (*(pOVar12->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0xc])(pOVar12);
          if (iVar5 == 0x40000) {
            this_01 = ON_SubD::Cast((ON_Object *)pOVar12);
            if (this_01 != (ON_SubD *)0x0) {
              ON_SubD::ReverseOrientation(this_01);
            }
          }
          else if (iVar5 == 0x20) {
            this_00 = ON_Mesh::Cast((ON_Object *)pOVar12);
            if (this_00 != (ON_Mesh *)0x0) {
              ON_Mesh::Flip(this_00);
            }
          }
          else if ((iVar5 == 0x10) &&
                  (pOVar9 = ON_Brep::Cast((ON_Object *)pOVar12), pOVar9 != (ON_Brep *)0x0)) {
            ON_Brep::Flip(pOVar9);
          }
        }
        SetProxy(this,(ON_Object *)0x0,(ON_Object *)pOVar12,true);
        this->m_geometry = (ON_Geometry *)pOVar12;
LAB_0056cdd8:
        this->m_parent_geometry = &pOVar12->super_ON_Geometry;
        goto LAB_0056cb48;
      }
LAB_0056cede:
      (*(pOVar12->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])(pOVar12);
    }
    else if (this->m__proxy2 == (ON_Object *)0x0) {
      pOVar9 = ON_BrepParent(this->m_parent_geometry);
      if ((pOVar9 == (ON_Brep *)0x0) &&
         (pOVar9 = ON_BrepParent(this->m_geometry), pOVar9 == (ON_Brep *)0x0)) {
        pOVar12 = ON_MeshParent(this->m_parent_geometry);
        if ((pOVar12 != (ON_Mesh *)0x0) ||
           (pOVar12 = ON_MeshParent(this->m_geometry), pOVar12 != (ON_Mesh *)0x0)) {
          if (4 < (this->m_component_index).m_type - mesh_vertex) {
            return false;
          }
          if ((this->m_component_index).m_index < 0) {
            return false;
          }
          TVar6 = (*(this->m_geometry->super_ON_Object)._vptr_ON_Object[0x22])();
          if ((this->m_component_index).m_type != TVar6) {
            return false;
          }
          if ((this->m_component_index).m_index != extraout_var_00) {
            return false;
          }
          pOVar12 = ON_Mesh::Duplicate(pOVar12);
          iVar5 = (*(pOVar12->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x1c])
                            (pOVar12,&iref->m_xform);
          if (((char)iVar5 == '\0') ||
             (proxy1 = ON_Mesh::MeshComponent(pOVar12,this->m_component_index),
             proxy1 == (ON_MeshComponentRef *)0x0)) goto LAB_0056cede;
          this->m_geometry = &proxy1->super_ON_Geometry;
          this->m_parent_geometry = &pOVar12->super_ON_Geometry;
          SetProxy(this,(ON_Object *)proxy1,(ON_Object *)pOVar12,true);
          goto LAB_0056cb48;
        }
      }
      else {
        pOVar10 = this->m__proxy1;
        if ((pOVar10 == (ON_Object *)0x0) ||
           ((((this->m__proxy2 != (ON_Object *)0x0 || (this->m__proxy_ref_count == (int *)0x0)) ||
             (*this->m__proxy_ref_count != 1)) || (pOVar10 == &this->m_geometry->super_ON_Object))))
        {
LAB_0056cd41:
          if (pOVar10 != (ON_Object *)0x0 || this->m__proxy_ref_count != (int *)0x0)
          goto LAB_0056cc14;
        }
        else {
          iVar5 = (*(this->m_geometry->super_ON_Object)._vptr_ON_Object[0x22])();
          if (extraout_var < 0 || 4 < iVar5 - 1U) {
            pOVar10 = this->m__proxy1;
            goto LAB_0056cd41;
          }
        }
        if (((ON_Brep *)this->m_parent_geometry == pOVar9 ||
             (ON_Brep *)this->m_parent_geometry == (ON_Brep *)0x0) &&
           (pOVar7 = this->m_geometry,
           pOVar11 = ON_Brep::BrepComponent(pOVar9,this->m_component_index), pOVar7 == pOVar11)) {
          pOVar12 = (ON_Mesh *)ON_Brep::Duplicate(pOVar9);
          iVar5 = (*(pOVar12->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x1c])
                            (pOVar12,&iref->m_xform);
          if ((char)iVar5 == '\0') goto LAB_0056cede;
          pOVar7 = ON_Brep::BrepComponent((ON_Brep *)pOVar12,this->m_component_index);
          if (pOVar7 != (ON_Geometry *)0x0) {
            SetProxy(this,(ON_Object *)0x0,(ON_Object *)pOVar12,true);
            this->m_geometry = pOVar7;
            goto LAB_0056cdd8;
          }
        }
      }
    }
LAB_0056cc14:
    bVar4 = false;
  }
  else {
    if ((((this->m__proxy2 == (ON_Object *)0x0) || (this->m__proxy_ref_count == (int *)0x0)) ||
        (*this->m__proxy_ref_count < 1)) ||
       ((pOVar7 = ON_Geometry::Cast(this->m__proxy2), pOVar7 == (ON_Geometry *)0x0 ||
        (iVar5 = (*(pOVar7->super_ON_Object)._vptr_ON_Object[0x1c])(pOVar7,&iref->m_xform),
        (char)iVar5 == '\0')))) goto LAB_0056cc14;
LAB_0056cb48:
    pOVar16 = &ON_Xform::IdentityTransformation;
    pOVar17 = &geometry_xform;
    for (lVar13 = 0x10; lVar13 != 0; lVar13 = lVar13 + -1) {
      pOVar17->m_xform[0][0] = pOVar16->m_xform[0][0];
      pOVar16 = (ON_Xform *)((long)pOVar16 + ((ulong)bVar18 * -2 + 1) * 8);
      pOVar17 = (ON_Xform *)((long)pOVar17 + ((ulong)bVar18 * -2 + 1) * 8);
    }
    lVar13 = (long)(this->m__iref).m_count;
    if (0 < lVar13) {
      pOVar16 = &(this->m__iref).m_a[lVar13 + -1].m_geometry_xform;
      pOVar17 = &geometry_xform;
      for (lVar14 = 0x10; lVar14 != 0; lVar14 = lVar14 + -1) {
        pOVar17->m_xform[0][0] = pOVar16->m_xform[0][0];
        pOVar16 = (ON_Xform *)((long)pOVar16 + (ulong)bVar18 * -0x10 + 8);
        pOVar17 = (ON_Xform *)((long)pOVar17 + ((ulong)bVar18 * -2 + 1) * 8);
      }
    }
    pOVar8 = ON_SimpleArray<ON_ObjRef_IRefID>::AppendNew(&this->m__iref);
    (pOVar8->m_iref_uuid).Data1 = (int)uVar15;
    (pOVar8->m_iref_uuid).Data2 = (short)((ulong)uVar15 >> 0x20);
    (pOVar8->m_iref_uuid).Data3 = (short)((ulong)uVar15 >> 0x30);
    *&(pOVar8->m_iref_uuid).Data4 = iref_id.Data4;
    lVar13 = 0x10;
    pOVar16 = &iref->m_xform;
    pOVar17 = &pOVar8->m_iref_xform;
    for (lVar14 = lVar13; lVar14 != 0; lVar14 = lVar14 + -1) {
      pOVar17->m_xform[0][0] = pOVar16->m_xform[0][0];
      pOVar16 = (ON_Xform *)((long)pOVar16 + (ulong)bVar18 * -0x10 + 8);
      pOVar17 = (ON_Xform *)((long)pOVar17 + (ulong)bVar18 * -0x10 + 8);
    }
    uVar2 = (iref->m_instance_definition_uuid).Data2;
    uVar3 = (iref->m_instance_definition_uuid).Data3;
    uVar15 = *(undefined8 *)(iref->m_instance_definition_uuid).Data4;
    (pOVar8->m_idef_uuid).Data1 = (iref->m_instance_definition_uuid).Data1;
    (pOVar8->m_idef_uuid).Data2 = uVar2;
    (pOVar8->m_idef_uuid).Data3 = uVar3;
    *(undefined8 *)(pOVar8->m_idef_uuid).Data4 = uVar15;
    pOVar8->m_idef_geometry_index = idef_geometry_index;
    ON_Xform::operator*(&local_b0,&iref->m_xform,&geometry_xform);
    pOVar16 = &local_b0;
    pOVar17 = &pOVar8->m_geometry_xform;
    for (; lVar13 != 0; lVar13 = lVar13 + -1) {
      pOVar17->m_xform[0][0] = pOVar16->m_xform[0][0];
      pOVar16 = (ON_Xform *)((long)pOVar16 + ((ulong)bVar18 * -2 + 1) * 8);
      pOVar17 = (ON_Xform *)((long)pOVar17 + (ulong)bVar18 * -0x10 + 8);
    }
    uVar2 = (pOVar8->m_iref_uuid).Data2;
    uVar3 = (pOVar8->m_iref_uuid).Data3;
    uVar15 = *(undefined8 *)(pOVar8->m_iref_uuid).Data4;
    (this->m_uuid).Data1 = (pOVar8->m_iref_uuid).Data1;
    (this->m_uuid).Data2 = uVar2;
    (this->m_uuid).Data3 = uVar3;
    *(undefined8 *)(this->m_uuid).Data4 = uVar15;
    bVar4 = true;
  }
  return bVar4;
}

Assistant:

bool ON_ObjRef::SetParentIRef( const ON_InstanceRef& iref,
                               ON_UUID iref_id,
                               int idef_geometry_index
                               )
{
  bool rc = false;

  if ( m__iref.Count() > 0 )
  {
    // nested irefs
    if (    0 == m__proxy2
         || 0 == m__proxy_ref_count 
         || *m__proxy_ref_count <= 0 )
    {
      return false;
    }
    ON_Geometry* proxy_geo = ON_Geometry::Cast(m__proxy2);
    if ( !proxy_geo )
      return false;
    if ( !proxy_geo->Transform(iref.m_xform) )
      return false;
    rc = true;
  }
  else if ( ON_COMPONENT_INDEX::invalid_type == m_component_index.m_type )
  {
    // handle top level objects    
    while ( m__proxy1 || m__proxy2 || m__proxy_ref_count )
    {
      // It it's an brep proxy for an extrusion object, then keep going.
      if (    0 != m__proxy1
           && 0 == m__proxy2 
           && 0 != m__proxy_ref_count 
           && 1 == *m__proxy_ref_count 
           && m__proxy1 != m_geometry
           && 0 != ON_Brep::Cast(m_geometry)
           )
      {
        // 13 July 2011 - Part of the fix for bug 87827
        // is to break here instead of returning false
        // because we have something like a brep proxy 
        // of an extrusion.
        break;        
      }
      return false;
    }

    if ( !m_geometry )
    {
      return false;
    }
    if ( m_geometry->ComponentIndex().m_type != ON_COMPONENT_INDEX::invalid_type )
    {
      return false;
    }
    if ( m_parent_geometry && m_geometry != m_parent_geometry )
    {
      return false;
    }
    ON_Geometry* proxy_geo = m_geometry->Duplicate();
    if ( !proxy_geo->Transform(iref.m_xform) )
    {
      delete proxy_geo;
      return false;
    }

    // 24 June 2024, Mikko, RH-82669:
    // Flip brep/mesh/SubD if the xform is orientation reversing.
    if (-1 == iref.m_xform.IsSimilarity())
    {
      switch (proxy_geo->ObjectType())
      {
      case ON::object_type::brep_object:
      {
        ON_Brep* brep = ON_Brep::Cast(proxy_geo);
        if (0 != brep)
          brep->Flip();
      }
      break;

      case ON::object_type::mesh_object:
      {
        ON_Mesh* mesh = ON_Mesh::Cast(proxy_geo);
        if (0 != mesh)
          mesh->Flip();
      }
      break;

      case ON::object_type::subd_object:
      {
        ON_SubD* subd = ON_SubD::Cast(proxy_geo);
        if (0 != subd)
          subd->ReverseOrientation();
      }
      break;

      default:
        break;
      }
    }

    // 13 July 2011 - Part of the fix for bug 87827
    // was to put the m_geometry and m_parent_geometry
    // assignments after the call to SetProxy() which
    // was zeroing m_geometry and m_parent_geometry.
    SetProxy(0,proxy_geo,true);
    m_geometry = proxy_geo;
    m_parent_geometry = proxy_geo;
    rc = true;
  }
  else
  {
    // handle brep and mesh subobjects
    // create proxy object
    if ( m__proxy2 )
      return false;

    const ON_Brep* parent_brep = ON_BrepParent(m_parent_geometry);
    if ( !parent_brep)
      parent_brep = ON_BrepParent(m_geometry);
    if ( parent_brep )
    {
      // handle breps and their parts

      // 6 June 2013, Mikko, RH-9846:
      // This is a near facsimile of the 87827 fix above.
      // If it's a brep proxy component for an extrusion object, then keep going.
      if (    0 != m__proxy1
           && 0 == m__proxy2 
           && 0 != m__proxy_ref_count 
           && 1 == *m__proxy_ref_count 
           && m__proxy1 != m_geometry
           && m_geometry->ComponentIndex().IsBrepComponentIndex()
           )
      {
        // brep proxy component for an extrusion object, keep going
      }
      else
      if ( m__proxy1 || m__proxy_ref_count )
      {
        return false;
      }
      if ( m_parent_geometry != parent_brep && 0 != m_parent_geometry )
      {
        return false;
      }
      if ( m_geometry != parent_brep->BrepComponent(m_component_index) )
      {
        return false;
      }
      ON_Brep* proxy_brep = parent_brep->Duplicate();
      if ( !proxy_brep->Transform(iref.m_xform) )
      {
        delete proxy_brep;
        return false;
      }
      const ON_Geometry* brep_component = proxy_brep->BrepComponent(m_component_index);
      if ( !brep_component )
      {
        delete brep_component;
        return false;
      }
      SetProxy(0,proxy_brep,true);
      m_geometry        = brep_component;
      m_parent_geometry = proxy_brep;
      rc = true;
    }
    else
    {
      const ON_Mesh* parent_mesh = ON_MeshParent(m_parent_geometry);
      if ( !parent_mesh)
        parent_mesh = ON_MeshParent(m_geometry);
      if ( parent_mesh  )
      {
        // handle meshes and their parts
        if ( m_component_index.IsMeshComponentIndex() )
        {
          if ( m_geometry->ComponentIndex() != m_component_index )
            return false;
          ON_Mesh* proxy_mesh = parent_mesh->Duplicate();
          if ( !proxy_mesh->Transform(iref.m_xform) )
          {
            delete proxy_mesh;
            return false;
          }
          ON_Geometry* proxy_component = proxy_mesh->MeshComponent(m_component_index);
          if( !proxy_component )
          {
            delete proxy_mesh;
            return false;
          }
          m_geometry = proxy_component;
          m_parent_geometry = proxy_mesh;
          SetProxy(proxy_component,proxy_mesh,true);
          rc = true;
        }
        else
        {
          return false;
        }
      }
    }
  }

  if ( rc )
  {
    // This is a valid reference to a piece of geometry
    // in an instance definition.

    ON_Xform geometry_xform(ON_Xform::IdentityTransformation);
    if ( m__iref.Count() > 0 )
      geometry_xform = m__iref.Last()->m_geometry_xform;

    ON_ObjRef_IRefID& this_ref     = m__iref.AppendNew();
    this_ref.m_iref_uuid           = iref_id;
    this_ref.m_iref_xform          = iref.m_xform;
    this_ref.m_idef_uuid           = iref.m_instance_definition_uuid;
    this_ref.m_idef_geometry_index = idef_geometry_index;
    this_ref.m_geometry_xform      = iref.m_xform*geometry_xform;

    m_uuid = this_ref.m_iref_uuid;
  }

  return rc;
}